

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar9 = (window->Scroll).x;
  fVar8 = (window->Scroll).y;
  fVar7 = (window->ScrollTarget).x;
  if (fVar7 < 3.4028235e+38) {
    fVar1 = (window->ScrollTargetCenterRatio).x;
    if ((((!snap_on_edges) || (0.0 < fVar1)) || (fVar9 = 0.0, (window->WindowPadding).x < fVar7)) &&
       ((fVar9 = fVar7, snap_on_edges && (1.0 <= fVar1)))) {
      fVar2 = (window->ContentSize).x;
      fVar3 = (window->WindowPadding).x;
      if (fVar2 + fVar3 + (GImGui->Style).ItemSpacing.x <= fVar7) {
        fVar9 = fVar3 + fVar3 + fVar2;
      }
    }
    fVar9 = fVar9 - fVar1 * ((window->InnerRect).Max.x - (window->InnerRect).Min.x);
  }
  fVar7 = (window->ScrollTarget).y;
  if (fVar7 < 3.4028235e+38) {
    fVar8 = (window->ScrollTargetCenterRatio).y;
    if (((snap_on_edges) && (fVar8 <= 0.0)) && (fVar7 <= (window->WindowPadding).y)) {
      fVar7 = 0.0;
    }
    if ((snap_on_edges) && (1.0 <= fVar8)) {
      fVar1 = (window->ContentSize).y;
      fVar2 = (window->WindowPadding).y;
      if (fVar1 + fVar2 + (GImGui->Style).ItemSpacing.y <= fVar7) {
        fVar7 = fVar2 + fVar2 + fVar1;
      }
    }
    fVar8 = fVar7 - fVar8 * ((window->InnerRect).Max.y - (window->InnerRect).Min.y);
  }
  IVar5.x = (float)(-(uint)(0.0 <= fVar9) & (uint)fVar9);
  IVar5.y = (float)(-(uint)(0.0 <= fVar8) & (uint)fVar8);
  auVar6._8_8_ = 0;
  auVar6._0_4_ = IVar5.x;
  auVar6._4_4_ = IVar5.y;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    auVar4._8_8_ = 0;
    auVar4._0_4_ = (window->ScrollMax).x;
    auVar4._4_4_ = (window->ScrollMax).y;
    auVar6 = minps(auVar6,auVar4);
    IVar5 = auVar6._0_8_;
  }
  return IVar5;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + GImGui->Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * window->InnerRect.GetWidth();
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * window->InnerRect.GetHeight();
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}